

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::TextFormat::Printer::PrintField
          (Printer *this,Message *message,Reflection *reflection,FieldDescriptor *field,
          TextGenerator *generator)

{
  pointer ppMVar1;
  bool bVar2;
  bool bVar3;
  CppType CVar4;
  int iVar5;
  FastFieldValuePrinter *pFVar6;
  Message *message_00;
  ulong uVar7;
  pointer ppMVar8;
  char *pcVar9;
  uint field_index;
  ulong uVar10;
  uint local_84;
  vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  sorted_map_field;
  StringPiece local_40;
  
  if ((((this->use_short_repeated_primitives_ == true) && ((~(byte)field[1] & 0x60) == 0)) &&
      (CVar4 = FieldDescriptor::cpp_type(field), CVar4 != CPPTYPE_STRING)) &&
     (CVar4 = FieldDescriptor::cpp_type(field), CVar4 != CPPTYPE_MESSAGE)) {
    PrintShortRepeatedField(this,message,reflection,field,generator);
    return;
  }
  if ((~(byte)field[1] & 0x60) == 0) {
    local_84 = Reflection::FieldSize(reflection,message,field);
  }
  else {
    bVar2 = Reflection::HasField(reflection,message,field);
    if ((bVar2) ||
       (local_84 = 0, *(char *)(*(long *)(*(long *)(field + 0x20) + 0x20) + 0x4b) == '\x01')) {
      local_84 = 1;
    }
  }
  sorted_map_field.
  super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sorted_map_field.
  super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sorted_map_field.
  super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = FieldDescriptor::is_map(field);
  uVar10 = 0;
  bVar3 = false;
  if (bVar2) {
    bVar3 = internal::MapFieldPrinterHelper::SortMap(message,reflection,field,&sorted_map_field);
  }
  uVar7 = 0;
  if (0 < (int)local_84) {
    uVar7 = (ulong)local_84;
  }
  for (; ppMVar1 = sorted_map_field.
                   super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish, uVar7 != uVar10; uVar10 = uVar10 + 1)
  {
    field_index = -(uint)((~(byte)field[1] & 0x60) != 0) | (uint)uVar10;
    PrintFieldName(this,message,field_index,local_84,reflection,field,generator);
    CVar4 = FieldDescriptor::cpp_type(field);
    if (CVar4 == CPPTYPE_MESSAGE) {
      pFVar6 = GetFieldPrinter(this,field);
      if ((~(byte)field[1] & 0x60) == 0) {
        if (bVar2) {
          message_00 = sorted_map_field.
                       super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar10];
        }
        else {
          message_00 = Reflection::GetRepeatedMessage(reflection,message,field,(uint)uVar10);
        }
      }
      else {
        message_00 = Reflection::GetMessage(reflection,message,field,(MessageFactory *)0x0);
      }
      (*pFVar6->_vptr_FastFieldValuePrinter[0xe])
                (pFVar6,message_00,(ulong)field_index,(ulong)local_84,(ulong)this->single_line_mode_
                 ,generator);
      (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[2])(generator);
      iVar5 = (*pFVar6->_vptr_FastFieldValuePrinter[0xf])
                        (pFVar6,message_00,(ulong)field_index,(ulong)local_84,
                         (ulong)this->single_line_mode_,generator);
      if ((char)iVar5 == '\0') {
        Print(this,message_00,generator);
      }
      (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[3])(generator);
      (*pFVar6->_vptr_FastFieldValuePrinter[0x10])
                (pFVar6,message_00,(ulong)field_index,(ulong)local_84,(ulong)this->single_line_mode_
                 ,generator);
    }
    else {
      stringpiece_internal::StringPiece::StringPiece(&local_40,": ");
      TextGenerator::PrintMaybeWithMarker(generator,local_40);
      PrintFieldValue(this,message,reflection,field,field_index,generator);
      pcVar9 = "\n";
      if (this->single_line_mode_ != false) {
        pcVar9 = " ";
      }
      (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])(generator,pcVar9,1);
    }
  }
  ppMVar8 = sorted_map_field.
            super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (bVar3 != false) {
    for (; ppMVar8 != ppMVar1; ppMVar8 = ppMVar8 + 1) {
      if (*ppMVar8 != (Message *)0x0) {
        (*((*ppMVar8)->super_MessageLite)._vptr_MessageLite[1])();
      }
    }
  }
  std::
  _Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::~_Vector_base(&sorted_map_field.
                   super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                 );
  return;
}

Assistant:

void TextFormat::Printer::PrintField(const Message& message,
                                     const Reflection* reflection,
                                     const FieldDescriptor* field,
                                     TextGenerator* generator) const {
  if (use_short_repeated_primitives_ && field->is_repeated() &&
      field->cpp_type() != FieldDescriptor::CPPTYPE_STRING &&
      field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
    PrintShortRepeatedField(message, reflection, field, generator);
    return;
  }

  int count = 0;

  if (field->is_repeated()) {
    count = reflection->FieldSize(message, field);
  } else if (reflection->HasField(message, field) ||
             field->containing_type()->options().map_entry()) {
    count = 1;
  }

  std::vector<const Message*> sorted_map_field;
  bool need_release = false;
  bool is_map = field->is_map();
  if (is_map) {
    need_release = internal::MapFieldPrinterHelper::SortMap(
        message, reflection, field, &sorted_map_field);
  }

  for (int j = 0; j < count; ++j) {
    const int field_index = field->is_repeated() ? j : -1;

    PrintFieldName(message, field_index, count, reflection, field, generator);

    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      const FastFieldValuePrinter* printer = GetFieldPrinter(field);
      const Message& sub_message =
          field->is_repeated()
              ? (is_map ? *sorted_map_field[j]
                        : reflection->GetRepeatedMessage(message, field, j))
              : reflection->GetMessage(message, field);
      printer->PrintMessageStart(sub_message, field_index, count,
                                 single_line_mode_, generator);
      generator->Indent();
      if (!printer->PrintMessageContent(sub_message, field_index, count,
                                        single_line_mode_, generator)) {
        Print(sub_message, generator);
      }
      generator->Outdent();
      printer->PrintMessageEnd(sub_message, field_index, count,
                               single_line_mode_, generator);
    } else {
      generator->PrintMaybeWithMarker(": ");
      // Write the field value.
      PrintFieldValue(message, reflection, field, field_index, generator);
      if (single_line_mode_) {
        generator->PrintLiteral(" ");
      } else {
        generator->PrintLiteral("\n");
      }
    }
  }

  if (need_release) {
    for (const Message* message_to_delete : sorted_map_field) {
      delete message_to_delete;
    }
  }
}